

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O0

void test_table_diff(void)

{
  spki_table *spki_table;
  long lVar1;
  spki_record *record;
  spki_record *record_00;
  spki_record *record_01;
  long in_FS_OFFSET;
  spki_record *test_record3;
  spki_record *test_record2;
  spki_record *test_record1;
  rtr_socket *socket;
  spki_table table2;
  spki_table table1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  record = create_record(1,10,100,(rtr_socket *)0x1);
  record_00 = create_record(2,0x14,200,(rtr_socket *)0x1);
  record_01 = create_record(3,0x1e,300,(rtr_socket *)0x1);
  spki_table = (spki_table *)(&table2.lock.__align + 6);
  spki_table_init(spki_table,(spki_update_fp)0x0);
  spki_table_init((spki_table *)&socket,(spki_update_fp)0x0);
  printf("Adding to table 1\n");
  _spki_table_add_assert(spki_table,record);
  _spki_table_add_assert(spki_table,record_00);
  printf("Adding to table 2\n");
  _spki_table_add_assert((spki_table *)&socket,record_00);
  _spki_table_add_assert((spki_table *)&socket,record_01);
  printf("Calculating diff\n");
  table2.cmp_fp = update_spki;
  spki_table_notify_diff((spki_table *)&socket,spki_table,(rtr_socket *)0x1);
  table2.cmp_fp = (hash_cmp_fp)0x0;
  printf("Freeing tables\n");
  spki_table_free(spki_table);
  spki_table_free((spki_table *)&socket);
  free(record);
  free(record_00);
  free(record_01);
  printf("%s() complete\n","test_table_diff");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void test_table_diff(void)
{
	struct spki_table table1;
	struct spki_table table2;
	struct rtr_socket *socket = (struct rtr_socket *)1;

	struct spki_record *test_record1 = create_record(1, 10, 100, socket);
	struct spki_record *test_record2 = create_record(2, 20, 200, socket);
	struct spki_record *test_record3 = create_record(3, 30, 300, socket);

	spki_table_init(&table1, NULL);
	spki_table_init(&table2, NULL);

	printf("Adding to table 1\n");
	_spki_table_add_assert(&table1, test_record1);
	_spki_table_add_assert(&table1, test_record2);

	printf("Adding to table 2\n");
	_spki_table_add_assert(&table2, test_record2);
	_spki_table_add_assert(&table2, test_record3);

	printf("Calculating diff\n");
	table1.update_fp = update_spki;
	table2.update_fp = update_spki;
	spki_table_notify_diff(&table2, &table1, socket);
	table1.update_fp = NULL;
	table2.update_fp = NULL;

	printf("Freeing tables\n");
	spki_table_free(&table1);
	spki_table_free(&table2);
	free(test_record1);
	free(test_record2);
	free(test_record3);

	printf("%s() complete\n", __func__);
}